

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dashel-posix.cpp
# Opt level: O1

void __thiscall Dashel::SocketStream::flush(SocketStream *this)

{
  size_t in_RCX;
  int in_R8D;
  
  if (-1 < (this->super_DisconnectableStream).super_SelectableStream.fd) {
    send(this,(int)*(undefined8 *)&(this->super_DisconnectableStream).field_0x1020,
         *(void **)&(this->super_DisconnectableStream).field_0x1030,in_RCX,in_R8D);
    ExpandableBuffer::clear((ExpandableBuffer *)&(this->super_DisconnectableStream).field_0x1020);
    return;
  }
  __assert_fail("fd >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/aseba-community[P]dashel/dashel/dashel-posix.cpp"
                ,0x1f6,"virtual void Dashel::SocketStream::flush()");
}

Assistant:

virtual void flush()
		{
			assert(fd >= 0);

#ifdef TCP_CORK
			int flag = 0;
			setsockopt(fd, IPPROTO_TCP, TCP_CORK, &flag, sizeof(flag));
			flag = 1;
			setsockopt(fd, IPPROTO_TCP, TCP_CORK, &flag, sizeof(flag));
#else
			send(sendBuffer.get(), sendBuffer.size());
			sendBuffer.clear();
#endif
		}